

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btCollisionWorld.cpp
# Opt level: O0

void __thiscall
btCollisionWorld::btCollisionWorld
          (btCollisionWorld *this,btDispatcher *dispatcher,btBroadphaseInterface *pairCache,
          btCollisionConfiguration *collisionConfiguration)

{
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  
  *in_RDI = &PTR__btCollisionWorld_002e27b8;
  btAlignedObjectArray<btCollisionObject_*>::btAlignedObjectArray
            ((btAlignedObjectArray<btCollisionObject_*> *)(in_RDI + 1));
  in_RDI[5] = in_RSI;
  btDispatcherInfo::btDispatcherInfo((btDispatcherInfo *)(in_RDI + 6));
  in_RDI[0xc] = in_RDX;
  in_RDI[0xd] = 0;
  *(undefined1 *)(in_RDI + 0xe) = 1;
  return;
}

Assistant:

btCollisionWorld::btCollisionWorld(btDispatcher* dispatcher,btBroadphaseInterface* pairCache, btCollisionConfiguration* collisionConfiguration)
:m_dispatcher1(dispatcher),
m_broadphasePairCache(pairCache),
m_debugDrawer(0),
m_forceUpdateAllAabbs(true)
{
}